

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void anon_unknown.dwarf_5a0093::createImplicitNets
               (HierarchicalInstanceSyntax *instance,ASTContext *context,NetType *netType,
               bitmask<slang::ast::InstanceFlags> flags,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  SyntaxKind SVar1;
  bool bVar2;
  uint uVar3;
  NamedPortConnectionSyntax *pNVar4;
  IdentifierNameSyntax *pIVar5;
  Compilation *compilation;
  NetType *in_RDX;
  void *in_RSI;
  long in_RDI;
  long in_R8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *in_R9;
  string_view sVar6;
  IdentifierNameSyntax *ins;
  iterator __end2;
  iterator __begin2;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> *__range2;
  Compilation *comp;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNets;
  PropertyExprSyntax *expr;
  PortConnectionSyntax *conn;
  const_iterator __end1;
  const_iterator __begin1;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *__range1;
  ASTContext ctx;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcd8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *in_stack_fffffffffffffce0;
  NetSymbol *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcf8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd10;
  IdentifierNameSyntax *syntax;
  IdentifierNameSyntax *args;
  string_view local_288;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_278;
  IdentifierNameSyntax *local_260;
  iterator local_258;
  iterator local_250;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *local_248;
  Compilation *local_240;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> local_228 [2];
  PropertyExprSyntax *local_1e8;
  PortConnectionSyntax *local_1e0;
  const_iterator local_1d8;
  const_iterator local_1c8;
  long local_1b8;
  bitmask<slang::ast::ASTFlags> local_1b0;
  bitmask<slang::ast::InstanceFlags> local_1a1;
  undefined1 local_1a0 [16];
  bitmask<slang::ast::ASTFlags> abStack_190 [5];
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *local_168;
  long local_160;
  void *local_150;
  long local_148;
  string_view *local_138;
  IdentifierNameSyntax *local_130;
  string_view *local_128;
  IdentifierNameSyntax *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a0;
  Compilation *local_88;
  size_t local_80;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *local_78;
  string_view *local_70;
  IdentifierNameSyntax *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  Compilation *local_18;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *local_10;
  IdentifierNameSyntax *local_8;
  
  local_168 = in_R9;
  local_160 = in_R8;
  local_150 = in_RSI;
  local_148 = in_RDI;
  bVar2 = slang::ast::NetType::isError(in_RDX);
  if (!bVar2) {
    memcpy(local_1a0,local_150,0x38);
    slang::bitmask<slang::ast::InstanceFlags>::bitmask(&local_1a1,FromBind);
    bVar2 = slang::bitmask<slang::ast::InstanceFlags>::has
                      ((bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffce0,
                       (bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffcd8);
    if (bVar2) {
      slang::bitmask<slang::ast::ASTFlags>::bitmask(&local_1b0,BindInstantiation);
      slang::bitmask<slang::ast::ASTFlags>::operator|=(abStack_190,&local_1b0);
    }
    local_1b8 = local_148 + 0x30;
    local_1c8 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::begin
                          ((SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)0x45bc78);
    local_1d8 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::end
                          ((SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)0x45bc95);
    while( true ) {
      bVar2 = slang::
              operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffce0,
                         (iterator_base<const_slang::syntax::PortConnectionSyntax_*> *)
                         in_stack_fffffffffffffcd8);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      local_1e0 = slang::
                  iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_false>
                               *)0x45bcd2);
      local_1e8 = (PropertyExprSyntax *)0x0;
      SVar1 = (local_1e0->super_SyntaxNode).kind;
      if (SVar1 == NamedPortConnection) {
        pNVar4 = slang::syntax::SyntaxNode::as<slang::syntax::NamedPortConnectionSyntax>
                           (&local_1e0->super_SyntaxNode);
        local_1e8 = pNVar4->expr;
      }
      else if (SVar1 == OrderedPortConnection) {
        slang::syntax::SyntaxNode::as<slang::syntax::OrderedPortConnectionSyntax>
                  (&local_1e0->super_SyntaxNode);
        local_1e8 = slang::not_null::operator_cast_to_PropertyExprSyntax_
                              ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x45bd29);
      }
      if (local_1e8 != (PropertyExprSyntax *)0x0) {
        slang::SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL>::SmallVector
                  ((SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> *)0x45bd78);
        slang::ast::Expression::findPotentiallyImplicitNets
                  ((SyntaxNode *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                   (ASTContext *)in_stack_fffffffffffffce8,
                   (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)
                   in_stack_fffffffffffffce0);
        local_240 = slang::ast::ASTContext::getCompilation((ASTContext *)0x45bda4);
        local_248 = local_228;
        local_250 = slang::SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::begin
                              (local_248);
        local_258 = slang::SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::end
                              (local_248);
        for (; local_250 != local_258; local_250 = local_250 + 1) {
          local_260 = *local_250;
          pIVar5 = (IdentifierNameSyntax *)(local_160 + 0x88);
          sVar6 = slang::parsing::Token::valueText
                            ((Token *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0))
          ;
          local_138 = &local_288;
          args = pIVar5;
          local_130 = pIVar5;
          local_128 = local_138;
          local_120 = pIVar5;
          local_70 = local_138;
          local_68 = pIVar5;
          local_288 = sVar6;
          local_78 = (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                      *)boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                        ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                                  ((basic_string_view<char,_std::char_traits<char>_> *)0x45bee2);
          local_80 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                     ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                               (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          compilation = (Compilation *)
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                        ::position_for(in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
          local_10 = local_78;
          local_20 = local_80;
          syntax = pIVar5;
          local_88 = compilation;
          local_18 = compilation;
          local_8 = pIVar5;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_30,(size_t)compilation);
          do {
            local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
            local_40 = boost::unordered::detail::foa::
                       table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                       ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                                 *)0x45bfc4);
            local_40 = local_40 + local_38;
            uVar3 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffffce8,(size_t)in_stack_fffffffffffffce0);
            local_44 = uVar3;
            if (uVar3 != 0) {
              local_50 = boost::unordered::detail::foa::
                         table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                         ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                                     *)0x45c01d);
              local_58 = local_50 + local_38 * 0xf;
              do {
                local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                in_stack_fffffffffffffcf8 =
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                             *)0x45c06d);
                in_stack_fffffffffffffd00 = local_10;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                          ((basic_string_view<char,_std::char_traits<char>_> *)0x45c09a);
                bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
                if (bVar2) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
                  goto LAB_0045c1a1;
                }
                local_44 = local_44 - 1 & local_44;
              } while (local_44 != 0);
            }
            in_stack_fffffffffffffcf7 =
                 boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
            if ((bool)in_stack_fffffffffffffcf7) {
              memset(&local_a0,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              ::table_locator(&local_a0);
              goto LAB_0045c1a1;
            }
            bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                              (&local_30,
                               (size_t)(syntax->super_NameSyntax).super_ExpressionSyntax.
                                       super_SyntaxNode.previewNode);
          } while (bVar2);
          memset(&local_a0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::table_locator(&local_a0);
LAB_0045c1a1:
          bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                            ((table_locator *)&local_a0);
          if (bVar2) {
            local_b0 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                       ::make_iterator((locator *)0x45c1c3);
            local_b1 = false;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                      (&local_278,&local_b0,&local_b1);
          }
          else if (pIVar5[1].super_NameSyntax.super_ExpressionSyntax.super_SyntaxNode.parent <
                   *(SyntaxNode **)
                    &pIVar5[1].super_NameSyntax.super_ExpressionSyntax.super_SyntaxNode) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
            ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                      (in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8,
                       CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce8
                      );
            local_c8 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                       ::make_iterator((locator *)0x45c245);
            local_e1[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                      (&local_278,&local_c8,local_e1);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
            ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                      ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                        *)sVar6._M_len,(size_t)sVar6._M_str,
                       (basic_string_view<char,_std::char_traits<char>_> *)args);
            local_f8 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                       ::make_iterator((locator *)0x45c2ad);
            local_111[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                      (&local_278,&local_f8,local_111);
          }
          if ((local_278.second & 1U) != 0) {
            in_stack_fffffffffffffce0 = local_168;
            in_stack_fffffffffffffce8 =
                 slang::ast::NetSymbol::createImplicit
                           (compilation,syntax,(NetType *)CONCAT44(uVar3,in_stack_fffffffffffffd10))
            ;
            slang::SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                      ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffce0,
                       (Symbol **)in_stack_fffffffffffffcd8);
          }
        }
        slang::SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL>::~SmallVector
                  ((SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> *)0x45c391);
      }
      slang::
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_false>
                  *)in_stack_fffffffffffffce0);
    }
  }
  return;
}

Assistant:

void createImplicitNets(const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                        const NetType& netType, bitmask<InstanceFlags> flags,
                        SmallSet<std::string_view, 8>& implicitNetNames,
                        SmallVectorBase<const Symbol*>& results) {
    // If no default nettype is set, we don't create implicit nets.
    if (netType.isError())
        return;

    ASTContext ctx = context;
    if (flags.has(InstanceFlags::FromBind))
        ctx.flags |= ASTFlags::BindInstantiation;

    for (auto conn : instance.connections) {
        const PropertyExprSyntax* expr = nullptr;
        switch (conn->kind) {
            case SyntaxKind::OrderedPortConnection:
                expr = conn->as<OrderedPortConnectionSyntax>().expr;
                break;
            case SyntaxKind::NamedPortConnection:
                expr = conn->as<NamedPortConnectionSyntax>().expr;
                break;
            default:
                break;
        }

        if (!expr)
            continue;

        SmallVector<const IdentifierNameSyntax*> implicitNets;
        Expression::findPotentiallyImplicitNets(*expr, ctx, implicitNets);

        auto& comp = ctx.getCompilation();
        for (auto ins : implicitNets) {
            if (implicitNetNames.emplace(ins->identifier.valueText()).second)
                results.push_back(&NetSymbol::createImplicit(comp, *ins, netType));
        }
    }
}